

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrs.cpp
# Opt level: O1

int __thiscall despot::FVRS::GetObservation(FVRS *this,double rand_num,RockSampleState *rockstate)

{
  bool bVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  double dVar6;
  double local_38;
  
  if ((this->super_BaseRockSample).num_rocks_ < 1) {
    uVar4 = 0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    local_38 = rand_num;
    do {
      uVar2 = BaseRockSample::GetRobPos(&this->super_BaseRockSample,&rockstate->super_State);
      dVar6 = (double)despot::Coord::EuclideanDistance
                                (uVar2,*(undefined8 *)
                                        ((this->super_BaseRockSample).rock_pos_.
                                         super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar5 * 8));
      dVar6 = exp2(-dVar6 / (this->super_BaseRockSample).half_efficiency_distance_);
      dVar6 = (dVar6 + 1.0) * 0.5;
      bVar1 = BaseRockSample::GetRock
                        (&this->super_BaseRockSample,&rockstate->super_State,(int)lVar5);
      if (dVar6 <= local_38) {
        bVar1 = !bVar1;
        local_38 = local_38 - dVar6;
        if (dVar6 < 1.0) {
          local_38 = local_38 / (1.0 - local_38);
        }
      }
      uVar3 = 1 << ((byte)lVar5 & 0x1f);
      if (bVar1 == false) {
        uVar3 = 0;
      }
      uVar4 = uVar4 | uVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->super_BaseRockSample).num_rocks_);
  }
  return uVar4;
}

Assistant:

int FVRS::GetObservation(double rand_num,
	const RockSampleState& rockstate) const {
	int obs = 0;
	for (int rock = 0; rock < num_rocks_; rock++) {
		double distance = Coord::EuclideanDistance(GetRobPos(&rockstate),
			rock_pos_[rock]);
		double efficiency = (1 + pow(2, -distance / half_efficiency_distance_))
			* 0.5;

		// cout << efficiency << endl;
		bool bit = 0;
		if (rand_num < efficiency) {
			bit = GetRock(&rockstate, rock) & E_GOOD;
		} else {
			bit = !(GetRock(&rockstate, rock) & E_GOOD);

			rand_num -= efficiency;
			if (efficiency < 1.0)
				rand_num /= (1.0 - rand_num);
		}

		if (bit)
			SetFlag(obs, rock);
	}
	return obs;
}